

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_params.c
# Opt level: O1

err_t bignParamsDec(bign_params *params,octet *der,size_t count)

{
  bool_t bVar1;
  size_t sVar2;
  size_t sVar3;
  octet *poVar4;
  err_t eVar5;
  octet *poVar6;
  size_t sVar7;
  size_t len;
  der_anchor_t CurveSeq [1];
  der_anchor_t FieldSeq [1];
  der_anchor_t ParamSeq [1];
  size_t local_a8;
  size_t local_a0;
  der_anchor_t local_98;
  der_anchor_t local_78;
  der_anchor_t local_58;
  
  bVar1 = memIsValid(params,0x150);
  if (bVar1 == 0) {
    return 0x6d;
  }
  bVar1 = memIsValid(der,count);
  if (bVar1 == 0) {
    return 0x6d;
  }
  local_a8 = 0x20;
  memSet(params,'\0',0x150);
  sVar2 = derTSEQDecStart(&local_58,der,count,0x30);
  poVar4 = (octet *)0xffffffffffffffff;
  if (sVar2 != 0xffffffffffffffff) {
    poVar4 = der + sVar2;
    sVar3 = derTSIZEDec2(poVar4,count - sVar2,2,1);
    if (sVar3 != 0xffffffffffffffff) {
      sVar7 = (count - sVar2) - sVar3;
      poVar4 = poVar4 + sVar3;
      sVar2 = derTSEQDecStart(&local_78,poVar4,sVar7,0x30);
      if (sVar2 != 0xffffffffffffffff) {
        sVar7 = sVar7 - sVar2;
        sVar3 = derOIDDec2(poVar4 + sVar2,sVar7,"1.2.112.0.2.0.34.101.45.4.1");
        if (sVar3 != 0xffffffffffffffff) {
          poVar6 = poVar4 + sVar2 + sVar3;
          sVar7 = sVar7 - sVar3;
          sVar2 = derTUINTDec((octet *)0x0,&local_a8,poVar6,sVar7,2);
          if (((sVar2 != 0xffffffffffffffff) && (local_a8 - 0x20 < 0x21)) &&
             ((0x100010001U >> (local_a8 - 0x20 & 0x3f) & 1) != 0)) {
            params->l = local_a8 << 2;
            local_a0 = derTUINTDec(params->p,&local_a8,poVar6,sVar7,2);
            if (local_a0 != 0xffffffffffffffff) {
              poVar6 = poVar6 + local_a0;
              sVar2 = derTSEQDecStop(poVar6,&local_78);
              if (sVar2 != 0xffffffffffffffff) {
                sVar7 = sVar7 - (local_a0 + sVar2);
                poVar6 = poVar6 + sVar2;
                sVar2 = derTSEQDecStart(&local_98,poVar6,sVar7,0x30);
                if (sVar2 != 0xffffffffffffffff) {
                  sVar7 = sVar7 - sVar2;
                  poVar6 = poVar6 + sVar2;
                  sVar2 = derTOCTDec2(params->a,poVar6,sVar7,4,local_a8);
                  if (sVar2 != 0xffffffffffffffff) {
                    sVar7 = sVar7 - sVar2;
                    poVar6 = poVar6 + sVar2;
                    sVar2 = derTOCTDec2(params->b,poVar6,sVar7,4,local_a8);
                    if (sVar2 != 0xffffffffffffffff) {
                      sVar7 = sVar7 - sVar2;
                      poVar6 = poVar6 + sVar2;
                      local_a0 = derTBITDec2(params->seed,poVar6,sVar7,3,0x40);
                      if (local_a0 != 0xffffffffffffffff) {
                        poVar6 = poVar6 + local_a0;
                        sVar2 = derTSEQDecStop(poVar6,&local_98);
                        if (sVar2 != 0xffffffffffffffff) {
                          sVar7 = sVar7 - (local_a0 + sVar2);
                          poVar6 = poVar6 + sVar2;
                          sVar2 = derTOCTDec2(params->yG,poVar6,sVar7,4,local_a8);
                          if (sVar2 != 0xffffffffffffffff) {
                            sVar7 = sVar7 - sVar2;
                            poVar6 = poVar6 + sVar2;
                            sVar2 = derTUINTDec2(params->q,poVar6,sVar7,2,local_a8);
                            if (sVar2 != 0xffffffffffffffff) {
                              poVar6 = poVar6 + sVar2;
                              sVar3 = derTSIZEDec2(poVar6,sVar7 - sVar2,2,1);
                              sVar2 = 0;
                              if (sVar3 != 0xffffffffffffffff) {
                                sVar2 = sVar3;
                              }
                              sVar3 = derTSEQDecStop(poVar6 + sVar2,&local_58);
                              poVar4 = (octet *)0xffffffffffffffff;
                              if (sVar3 != 0xffffffffffffffff) {
                                poVar4 = poVar6 + sVar2 + (sVar3 - (long)der);
                              }
                              goto LAB_00122c99;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    poVar4 = (octet *)0xffffffffffffffff;
  }
LAB_00122c99:
  eVar5 = 0;
  if (poVar4 != (octet *)count) {
    eVar5 = 0x132;
  }
  if (poVar4 == (octet *)0xffffffffffffffff) {
    eVar5 = 0x132;
  }
  return eVar5;
}

Assistant:

err_t bignParamsDec(bign_params* params, const octet der[], size_t count)
{
	size_t len;
	if (!memIsValid(params, sizeof(bign_params)) ||
		!memIsValid(der, count))
		return ERR_BAD_INPUT;
	len = bignParamsDec_internal(params, der, count);
	if (len == SIZE_MAX || len != count)
		return ERR_BAD_FORMAT;
	return ERR_OK;
}